

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Meter meter;
  undefined1 local_78 [64];
  undefined1 local_38 [16];
  __node_base_ptr ap_Stack_28 [2];
  
  local_78._32_8_ = ap_Stack_28;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._48_16_ = ZEXT416(0) << 0x40;
  local_78._40_8_ = 1;
  local_38._0_8_ = 0x3f800000;
  unique0x100002cc = local_78._48_16_;
  test(this,in,k,threshold,(Meter *)local_78);
  uVar1 = local_78._24_8_;
  dVar2 = Meter::precision((Meter *)local_78);
  dVar3 = Meter::recall((Meter *)local_78);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_78 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter;
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}